

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O0

int Jf_ObjCutFilterBoth(Jf_Man_t *p,Jf_Cut_t **pSto,int c)

{
  Jf_Cut_t *pJVar1;
  int iVar2;
  int iVar3;
  Jf_Cut_t *t_1;
  Jf_Cut_t *t;
  int local_28;
  int last;
  int k;
  int c_local;
  Jf_Cut_t **pSto_local;
  Jf_Man_t *p_local;
  
  for (local_28 = 0; local_28 < c; local_28 = local_28 + 1) {
    if (((pSto[local_28]->pCut[0] <= pSto[c]->pCut[0]) &&
        ((pSto[c]->Sign & pSto[local_28]->Sign) == pSto[local_28]->Sign)) &&
       (iVar2 = Jf_CutIsContained1(pSto[c]->pCut,pSto[local_28]->pCut), iVar2 != 0)) {
      pSto[c]->pCut[0] = -1;
      return c;
    }
  }
  t._4_4_ = 0;
  for (local_28 = 0; local_28 < c; local_28 = local_28 + 1) {
    if ((((pSto[local_28]->pCut[0] <= pSto[c]->pCut[0]) ||
         ((pSto[c]->Sign & pSto[local_28]->Sign) != pSto[c]->Sign)) ||
        (iVar3 = Jf_CutIsContained1(pSto[local_28]->pCut,pSto[c]->pCut), iVar2 = t._4_4_, iVar3 == 0
        )) && (iVar2 = t._4_4_ + 1, t._4_4_ != local_28)) {
      pJVar1 = pSto[t._4_4_];
      pSto[t._4_4_] = pSto[local_28];
      pSto[local_28] = pJVar1;
    }
    t._4_4_ = iVar2;
  }
  if (t._4_4_ <= c) {
    if (t._4_4_ < c) {
      pJVar1 = pSto[t._4_4_];
      pSto[t._4_4_] = pSto[c];
      pSto[c] = pJVar1;
    }
    return t._4_4_;
  }
  __assert_fail("last <= c",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaJf.c"
                ,0x30e,"int Jf_ObjCutFilterBoth(Jf_Man_t *, Jf_Cut_t **, int)");
}

Assistant:

int Jf_ObjCutFilterBoth( Jf_Man_t * p, Jf_Cut_t ** pSto, int c )
{
    int k, last;
    // filter this cut using other cuts
    for ( k = 0; k < c; k++ )
        if ( pSto[c]->pCut[0] >= pSto[k]->pCut[0] && 
            (pSto[c]->Sign & pSto[k]->Sign) == pSto[k]->Sign && 
             Jf_CutIsContained1(pSto[c]->pCut, pSto[k]->pCut) )
        {
                pSto[c]->pCut[0] = -1;
                return c;
        }
    // filter other cuts using this cut
    for ( k = last = 0; k < c; k++ )
        if ( !(pSto[c]->pCut[0] < pSto[k]->pCut[0] && 
              (pSto[c]->Sign & pSto[k]->Sign) == pSto[c]->Sign && 
               Jf_CutIsContained1(pSto[k]->pCut, pSto[c]->pCut)) )
        {
            if ( last++ == k )
                continue;
            ABC_SWAP( Jf_Cut_t *, pSto[last-1], pSto[k] );
        }
    assert( last <= c );
    if ( last < c )
        ABC_SWAP( Jf_Cut_t *, pSto[last], pSto[c] );
    return last;
}